

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ErrorCheckUsingSetCursorPosToExtendParentBoundaries(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar3 = GImGui->CurrentWindow;
  (pIVar3->DC).IsSetPos = false;
  IVar1 = (pIVar3->DC).CursorPos;
  IVar2 = (pIVar3->DC).CursorMaxPos;
  fVar8 = IVar2.x;
  fVar9 = IVar2.y;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
  uVar4 = -(uint)(fVar6 <= fVar8);
  uVar5 = -(uint)(fVar7 <= fVar9);
  (pIVar3->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar5 & (uint)fVar7,~uVar4 & (uint)fVar6) |
               CONCAT44((uint)fVar9 & uVar5,(uint)fVar8 & uVar4));
  return;
}

Assistant:

void ImGui::ErrorCheckUsingSetCursorPosToExtendParentBoundaries()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->DC.IsSetPos);
    window->DC.IsSetPos = false;
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (window->DC.CursorPos.x <= window->DC.CursorMaxPos.x && window->DC.CursorPos.y <= window->DC.CursorMaxPos.y)
        return;
    if (window->SkipItems)
        return;
    IM_ASSERT(0 && "Code uses SetCursorPos()/SetCursorScreenPos() to extend window/parent boundaries. Please submit an item e.g. Dummy() to validate extent.");
#else
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, window->DC.CursorPos);
#endif
}